

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  __m128 afVar3;
  __m128 afVar4;
  __m128 afVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  __m128 *pafVar10;
  int iVar11;
  undefined1 (*pauVar12) [16];
  uint uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM3 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  __m128 afVar28;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 local_99;
  long local_98;
  long local_90;
  __m128 local_88;
  Mat *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48 [2];
  float afStack_40 [4];
  
  p_Var1 = this->_vptr_BinaryOp_x86[-3];
  local_70 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar19._0_4_ = *(float *)*pauVar12 + fVar18;
            auVar19._4_4_ = *(float *)((long)*pauVar12 + 4) + fVar18;
            auVar19._8_4_ = *(float *)((long)*pauVar12 + 8) + fVar18;
            auVar19._12_4_ = *(float *)((long)*pauVar12 + 0xc) + fVar18;
            *pauVar12 = auVar19;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) =
                 *(float *)((long)*pauVar12 + lVar14 * 4) + fVar18;
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 1:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar22._0_4_ = *(float *)*pauVar12 - fVar18;
            auVar22._4_4_ = *(float *)((long)*pauVar12 + 4) - fVar18;
            auVar22._8_4_ = *(float *)((long)*pauVar12 + 8) - fVar18;
            auVar22._12_4_ = *(float *)((long)*pauVar12 + 0xc) - fVar18;
            *pauVar12 = auVar22;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) =
                 *(float *)((long)*pauVar12 + lVar14 * 4) - fVar18;
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 2:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar20._0_4_ = *(float *)*pauVar12 * fVar18;
            auVar20._4_4_ = *(float *)((long)*pauVar12 + 4) * fVar18;
            auVar20._8_4_ = *(float *)((long)*pauVar12 + 8) * fVar18;
            auVar20._12_4_ = *(float *)((long)*pauVar12 + 0xc) * fVar18;
            *pauVar12 = auVar20;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) =
                 *(float *)((long)*pauVar12 + lVar14 * 4) * fVar18;
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 3:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      fVar18 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar21._0_4_ = *(float *)*pauVar12 * fVar18;
            auVar21._4_4_ = *(float *)((long)*pauVar12 + 4) * fVar18;
            auVar21._8_4_ = *(float *)((long)*pauVar12 + 8) * fVar18;
            auVar21._12_4_ = *(float *)((long)*pauVar12 + 0xc) * fVar18;
            *pauVar12 = auVar21;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) =
                 *(float *)((long)*pauVar12 + lVar14 * 4) * fVar18;
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 4:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar7._4_4_ = fVar18;
            auVar7._0_4_ = fVar18;
            auVar7._8_4_ = fVar18;
            auVar7._12_4_ = fVar18;
            auVar23 = maxps(*pauVar12,auVar7);
            *pauVar12 = auVar23;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            fVar24 = *(float *)(*pauVar12 + lVar14 * 4);
            if (*(float *)(*pauVar12 + lVar14 * 4) <= fVar18) {
              fVar24 = fVar18;
            }
            *(float *)(*pauVar12 + lVar14 * 4) = fVar24;
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 5:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar6._4_4_ = fVar18;
            auVar6._0_4_ = fVar18;
            auVar6._8_4_ = fVar18;
            auVar6._12_4_ = fVar18;
            auVar23 = minps(*pauVar12,auVar6);
            *pauVar12 = auVar23;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            fVar24 = *(float *)(*pauVar12 + lVar14 * 4);
            if (fVar18 <= *(float *)(*pauVar12 + lVar14 * 4)) {
              fVar24 = fVar18;
            }
            *(float *)(*pauVar12 + lVar14 * 4) = fVar24;
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 6:
    local_98 = (long)bottom_top_blob->c;
    if (0 < local_98) {
      local_68 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_90 = 0;
      local_58 = ZEXT416((uint)local_68);
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      do {
        pafVar10 = (__m128 *)
                   (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
        local_48[1] = fStack_64;
        local_48[0] = local_68;
        afStack_40[1] = fStack_5c;
        afStack_40[0] = fStack_60;
        if (iVar11 < 4) {
          iVar8 = 0;
        }
        else {
          iVar15 = 0;
          do {
            local_88 = *pafVar10;
            afVar28 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                ((binary_op_pow *)&local_99,&local_88,(__m128 *)local_48);
            uVar2 = afVar28._0_8_;
            local_88[2] = (float)extraout_XMM0_Dc_01;
            local_88[0] = (float)(int)uVar2;
            local_88[1] = (float)(int)((ulong)uVar2 >> 0x20);
            local_88[3] = extraout_XMM0_Dd_01;
            afVar5[2] = (float)extraout_XMM0_Dc_01;
            afVar5[0] = (float)(int)uVar2;
            afVar5[1] = (float)(int)((ulong)uVar2 >> 0x20);
            afVar5[3] = extraout_XMM0_Dd_01;
            *pafVar10 = afVar5;
            pafVar10 = pafVar10 + 1;
            iVar8 = iVar15 + 4;
            iVar16 = iVar15 + 7;
            iVar15 = iVar8;
          } while (iVar16 < iVar11);
        }
        if (iVar11 - iVar8 != 0 && iVar8 <= iVar11) {
          lVar17 = 0;
          do {
            fVar18 = powf((*pafVar10)[lVar17],(float)local_58._0_4_);
            (*pafVar10)[lVar17] = fVar18;
            lVar17 = lVar17 + 1;
          } while (iVar11 - iVar8 != (int)lVar17);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
    }
    break;
  case 7:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar23._0_4_ = fVar18 - *(float *)*pauVar12;
            auVar23._4_4_ = fVar18 - *(float *)((long)*pauVar12 + 4);
            auVar23._8_4_ = fVar18 - *(float *)((long)*pauVar12 + 8);
            auVar23._12_4_ = fVar18 - *(float *)((long)*pauVar12 + 0xc);
            *pauVar12 = auVar23;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) =
                 fVar18 - *(float *)((long)*pauVar12 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 8:
    iVar11 = bottom_top_blob->c;
    if (0 < (long)iVar11) {
      fVar18 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        pauVar12 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar9 < 4) {
          uVar13 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar23 = *pauVar12;
            in_XMM3 = rcpps(in_XMM3,auVar23);
            fVar24 = fVar18 * in_XMM3._0_4_;
            fVar25 = fVar18 * in_XMM3._4_4_;
            fVar26 = fVar18 * in_XMM3._8_4_;
            fVar27 = fVar18 * in_XMM3._12_4_;
            *(float *)*pauVar12 = (fVar18 - auVar23._0_4_ * fVar24) * in_XMM3._0_4_ + fVar24;
            *(float *)(*pauVar12 + 4) = (fVar18 - auVar23._4_4_ * fVar25) * in_XMM3._4_4_ + fVar25;
            *(float *)(*pauVar12 + 8) = (fVar18 - auVar23._8_4_ * fVar26) * in_XMM3._8_4_ + fVar26;
            *(float *)(*pauVar12 + 0xc) =
                 (fVar18 - auVar23._12_4_ * fVar27) * in_XMM3._12_4_ + fVar27;
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 4;
            uVar13 = uVar9 & 0xfffffffc;
          } while (iVar8 < (int)uVar9);
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)(*pauVar12 + lVar14 * 4) = fVar18 / *(float *)(*pauVar12 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar11);
    }
    break;
  case 9:
    local_98 = (long)bottom_top_blob->c;
    if (0 < local_98) {
      local_68 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_90 = 0;
      local_58 = ZEXT416((uint)local_68);
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      do {
        pafVar10 = (__m128 *)
                   (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
        local_48[1] = fStack_64;
        local_48[0] = local_68;
        afStack_40[1] = fStack_5c;
        afStack_40[0] = fStack_60;
        if (iVar11 < 4) {
          iVar8 = 0;
        }
        else {
          iVar15 = 0;
          do {
            local_88 = *pafVar10;
            afVar28 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                ((binary_op_rpow *)&local_99,&local_88,(__m128 *)local_48);
            uVar2 = afVar28._0_8_;
            local_88[2] = (float)extraout_XMM0_Dc_00;
            local_88[0] = (float)(int)uVar2;
            local_88[1] = (float)(int)((ulong)uVar2 >> 0x20);
            local_88[3] = extraout_XMM0_Dd_00;
            afVar4[2] = (float)extraout_XMM0_Dc_00;
            afVar4[0] = (float)(int)uVar2;
            afVar4[1] = (float)(int)((ulong)uVar2 >> 0x20);
            afVar4[3] = extraout_XMM0_Dd_00;
            *pafVar10 = afVar4;
            pafVar10 = pafVar10 + 1;
            iVar8 = iVar15 + 4;
            iVar16 = iVar15 + 7;
            iVar15 = iVar8;
          } while (iVar16 < iVar11);
        }
        if (iVar11 - iVar8 != 0 && iVar8 <= iVar11) {
          lVar17 = 0;
          do {
            fVar18 = powf((float)local_58._0_4_,(*pafVar10)[lVar17]);
            (*pafVar10)[lVar17] = fVar18;
            lVar17 = lVar17 + 1;
          } while (iVar11 - iVar8 != (int)lVar17);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
    }
    break;
  case 10:
    local_98 = (long)bottom_top_blob->c;
    if (0 < local_98) {
      local_68 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_90 = 0;
      local_58 = ZEXT416((uint)local_68);
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      do {
        pafVar10 = (__m128 *)
                   (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
        local_48[1] = fStack_64;
        local_48[0] = local_68;
        afStack_40[1] = fStack_5c;
        afStack_40[0] = fStack_60;
        if (iVar11 < 4) {
          iVar8 = 0;
        }
        else {
          iVar15 = 0;
          do {
            local_88 = *pafVar10;
            afVar28 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                ((binary_op_atan2 *)&local_99,&local_88,(__m128 *)local_48);
            uVar2 = afVar28._0_8_;
            local_88[2] = (float)extraout_XMM0_Dc_02;
            local_88[0] = (float)(int)uVar2;
            local_88[1] = (float)(int)((ulong)uVar2 >> 0x20);
            local_88[3] = extraout_XMM0_Dd_02;
            afVar3[2] = (float)extraout_XMM0_Dc_02;
            afVar3[0] = (float)(int)uVar2;
            afVar3[1] = (float)(int)((ulong)uVar2 >> 0x20);
            afVar3[3] = extraout_XMM0_Dd_02;
            *pafVar10 = afVar3;
            pafVar10 = pafVar10 + 1;
            iVar8 = iVar15 + 4;
            iVar16 = iVar15 + 7;
            iVar15 = iVar8;
          } while (iVar16 < iVar11);
        }
        if (iVar11 - iVar8 != 0 && iVar8 <= iVar11) {
          lVar17 = 0;
          do {
            fVar18 = atan2f((*pafVar10)[lVar17],(float)local_58._0_4_);
            (*pafVar10)[lVar17] = fVar18;
            lVar17 = lVar17 + 1;
          } while (iVar11 - iVar8 != (int)lVar17);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
    }
    break;
  case 0xb:
    local_98 = (long)bottom_top_blob->c;
    if (0 < local_98) {
      local_68 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_90 = 0;
      local_58 = ZEXT416((uint)local_68);
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      do {
        pafVar10 = (__m128 *)
                   (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
        local_48[1] = fStack_64;
        local_48[0] = local_68;
        afStack_40[1] = fStack_5c;
        afStack_40[0] = fStack_60;
        if (iVar11 < 4) {
          iVar8 = 0;
        }
        else {
          iVar15 = 0;
          do {
            local_88 = *pafVar10;
            afVar28 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4
                                (&local_99,&local_88,(__m128 *)local_48);
            uVar2 = afVar28._0_8_;
            local_88[2] = (float)extraout_XMM0_Dc;
            local_88[0] = (float)(int)uVar2;
            local_88[1] = (float)(int)((ulong)uVar2 >> 0x20);
            local_88[3] = extraout_XMM0_Dd;
            afVar28[2] = (float)extraout_XMM0_Dc;
            afVar28[0] = (float)(int)uVar2;
            afVar28[1] = (float)(int)((ulong)uVar2 >> 0x20);
            afVar28[3] = extraout_XMM0_Dd;
            *pafVar10 = afVar28;
            pafVar10 = pafVar10 + 1;
            iVar8 = iVar15 + 4;
            iVar16 = iVar15 + 7;
            iVar15 = iVar8;
          } while (iVar16 < iVar11);
        }
        if (iVar11 - iVar8 != 0 && iVar8 <= iVar11) {
          lVar17 = 0;
          do {
            fVar18 = atan2f((float)local_58._0_4_,(*pafVar10)[lVar17]);
            (*pafVar10)[lVar17] = fVar18;
            lVar17 = lVar17 + 1;
          } while (iVar11 - iVar8 != (int)lVar17);
        }
        local_90 = local_90 + 1;
      } while (local_90 != local_98);
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_functor;

    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    return 0;
}